

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# islist.h
# Opt level: O2

void __thiscall
soplex::IsList<soplex::SVSetBase<double>::DLPSV>::move
          (IsList<soplex::SVSetBase<double>::DLPSV> *this,ptrdiff_t delta)

{
  DLPSV *pDVar1;
  DLPSV *pDVar2;
  DLPSV *pDVar3;
  
  if (this->the_first != (DLPSV *)0x0) {
    pDVar1 = (DLPSV *)((long)&(this->the_last->super_SVectorBase<double>).m_elem + delta);
    this->the_last = pDVar1;
    pDVar2 = (DLPSV *)((long)&(this->the_first->super_SVectorBase<double>).m_elem + delta);
    this->the_first = pDVar2;
    while (pDVar3 = pDVar2, pDVar3 != (DLPSV *)0x0) {
      if (pDVar3 != pDVar1) {
        pDVar3->thenext =
             (DLPSV *)((long)&(pDVar3->thenext->super_SVectorBase<double>).m_elem + delta);
        pDVar1 = this->the_last;
      }
      pDVar2 = (DLPSV *)0x0;
      if (pDVar1 != pDVar3) {
        pDVar2 = pDVar3->thenext;
      }
    }
  }
  return;
}

Assistant:

void move(ptrdiff_t delta)
   {
      if(the_first)
      {
         T* elem;
         the_last  = reinterpret_cast<T*>(reinterpret_cast<char*>(the_last) + delta);
         the_first = reinterpret_cast<T*>(reinterpret_cast<char*>(the_first) + delta);

         for(elem = first(); elem; elem = next(elem))
            if(elem != last())
               elem->next() = reinterpret_cast<T*>(reinterpret_cast<char*>(elem->next()) + delta);
      }
   }